

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreconditionFireTheSetException_Test::
TestBody(ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreconditionFireTheSetException_Test
         *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  PreConditionFailedEx *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  int oldY;
  int oldX;
  undefined1 in_stack_fffffffffffffe9f;
  AssertionResult *in_stack_fffffffffffffea0;
  int *in_stack_fffffffffffffea8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  char *in_stack_fffffffffffffeb8;
  int line;
  char *in_stack_fffffffffffffec0;
  AssertionResult *this_02;
  Type in_stack_fffffffffffffecc;
  Type type;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult *this_03;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  AssertionResult *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertionResult local_d8;
  string local_c8 [20];
  int in_stack_ffffffffffffff4c;
  TestClassWithOutInvariant *in_stack_ffffffffffffff50;
  AssertionResult local_98;
  string local_88 [48];
  AssertionResult local_58 [3];
  byte local_19;
  ConstCharPtr local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = *(undefined4 *)(in_RDI + 0x10);
  local_10 = *(undefined4 *)(in_RDI + 0x14);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_18,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_18);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      anon_unknown.dwarf_114b::TestClassWithOutInvariant::setX
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    if ((local_19 & 1) != 0) goto LAB_0014173a;
    local_18.value =
         "Expected: sut.setX(0) throws an exception of type PreConditionFailedEx.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffed0);
  testing::internal::AssertHelper::AssertHelper
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
  testing::Message::~Message((Message *)0x1416ef);
LAB_0014173a:
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10.ptr_,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_88);
    testing::Message::~Message((Message *)0x141839);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1418b1);
  this_03 = &local_98;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10.ptr_,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_c8);
    testing::Message::~Message((Message *)0x1419c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x141a3e);
  this_02 = &local_d8;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8,(int *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffecc);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    in_stack_fffffffffffffeb8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x141ad5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,&this_02->success_,
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x141b32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x141b87);
  this_01 = (AssertionResult *)&stack0xffffffffffffff08;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),(int *)this_01,
             (int *)in_stack_fffffffffffffea0);
  line = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_03);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x141c15)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffeb0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x141c63);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x141caf);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithOutInvariant, ThatACallToAFailingPreconditionFireTheSetException)
{
  auto oldX = sut.x;
  auto oldY = sut.y;
  EXPECT_THROW(sut.setX(0), PreConditionFailedEx);

  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);

  EXPECT_EQ(oldX, sut.x);
  EXPECT_EQ(oldY, sut.y);
}